

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>::
find<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Entry,unsigned_long_const&>
          (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
           *this,ArrayPtr<kj::HashMap<unsigned_long,_capnp::SchemaLoader::Impl::RequiredSize>::Entry>
                 table,unsigned_long *params)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar4;
  uint hash;
  Entry *pEVar5;
  long *in_R8;
  Maybe<unsigned_long> MVar6;
  
  pEVar5 = table.ptr;
  aVar4.value = table.size_;
  if (*(long *)&pEVar5[1].value != 0) {
    hash = (uint)((int)((ulong)*in_R8 >> 0x20) * 0xbfe3 + (int)*in_R8 != 0);
    uVar2 = kj::_::chooseBucket(hash,(uint)*(long *)&pEVar5[1].value);
    aVar4 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
            *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)&pEVar5[1].value;
    while( true ) {
      uVar3 = (ulong)uVar2;
      iVar1 = *(int *)(pEVar5[1].key + 4 + uVar3 * 8);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)(pEVar5[1].key + uVar3 * 8) == hash)) &&
         (*(long *)(table.size_ + (ulong)(iVar1 - 2) * 0x10) == *in_R8)) {
        *this = (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>
                 )0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_004301ce;
      }
      uVar2 = (uint)(uVar3 + 1);
      if (uVar3 + 1 == aVar4.value) {
        uVar2 = 0;
      }
    }
  }
  *this = (HashIndex<kj::HashMap<unsigned_long,capnp::SchemaLoader::Impl::RequiredSize>::Callbacks>)
          0x0;
LAB_004301ce:
  MVar6.ptr.field_1.value = aVar4.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }